

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::ContextArray::ContextArray(ContextArray *this,Storage storage,Context *context)

{
  deUint32 err;
  Context *context_local;
  Storage storage_local;
  ContextArray *this_local;
  
  gls::Array::Array(&this->super_Array);
  (this->super_Array)._vptr_Array = (_func_int **)&PTR__ContextArray_032e6a70;
  this->m_storage = storage;
  this->m_ctx = context;
  this->m_glBuffer = 0;
  this->m_bound = false;
  this->m_attribNdx = 0;
  this->m_size = 0;
  this->m_data = (char *)0x0;
  this->m_componentCount = 1;
  this->m_target = TARGET_ARRAY;
  this->m_inputType = INPUTTYPE_FLOAT;
  this->m_outputType = OUTPUTTYPE_VEC4;
  this->m_normalize = false;
  this->m_stride = 0;
  this->m_offset = 0;
  if (this->m_storage == STORAGE_BUFFER) {
    (*this->m_ctx->_vptr_Context[0x26])(this->m_ctx,1,&this->m_glBuffer);
    err = (*this->m_ctx->_vptr_Context[0x79])();
    glu::checkError(err,"glGenBuffers()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsVertexArrayTests.cpp"
                    ,0x1d3);
  }
  return;
}

Assistant:

ContextArray::ContextArray (Storage storage, sglr::Context& context)
	: m_storage			(storage)
	, m_ctx				(context)
	, m_glBuffer		(0)
	, m_bound			(false)
	, m_attribNdx		(0)
	, m_size			(0)
	, m_data			(DE_NULL)
	, m_componentCount	(1)
	, m_target			(Array::TARGET_ARRAY)
	, m_inputType		(Array::INPUTTYPE_FLOAT)
	, m_outputType		(Array::OUTPUTTYPE_VEC4)
	, m_normalize		(false)
	, m_stride			(0)
	, m_offset			(0)
{
	if (m_storage == STORAGE_BUFFER)
	{
		m_ctx.genBuffers(1, &m_glBuffer);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glGenBuffers()");
	}
}